

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int test_unsigned<unsigned_int>(char *Name)

{
  uint uVar1;
  ostream *poVar2;
  uint8_t local_28 [4];
  uint8_t local_24 [4];
  uint tmp2;
  uint8_t tmp [4];
  uint8_t cst_4_be [4];
  uint8_t cst_4_le [4];
  char *Name_local;
  
  memset(tmp,0,4);
  memset(&tmp2,0,4);
  tmp[0] = '\x04';
  tmp2 = CONCAT13(4,(undefined3)tmp2);
  uVar1 = intmem::loadu_le<unsigned_int>(tmp);
  if (uVar1 == 4) {
    uVar1 = intmem::loadu_be<unsigned_int>((uint8_t *)&tmp2);
    if (uVar1 == 4) {
      uVar1 = intmem::load_le<unsigned_int>((uint *)tmp);
      if (uVar1 == 4) {
        uVar1 = intmem::load_be<unsigned_int>(&tmp2);
        if (uVar1 == 4) {
          intmem::storeu_le<unsigned_int>(local_24,4);
          if (local_24 == tmp) {
            intmem::storeu_be<unsigned_int>(local_24,4);
            if (local_24 == (uint8_t  [4])tmp2) {
              intmem::store_le<unsigned_int>((uint *)local_28,4);
              if (local_28 == tmp) {
                intmem::storeu_be<unsigned_int>(local_28,4);
                if (local_28 == (uint8_t  [4])tmp2) {
                  Name_local._4_4_ = 0;
                }
                else {
                  poVar2 = std::operator<<((ostream *)&std::cerr,Name);
                  poVar2 = std::operator<<(poVar2,": error storing BE integer!");
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  Name_local._4_4_ = 1;
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cerr,Name);
                poVar2 = std::operator<<(poVar2,": error storing LE integer!");
                std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                Name_local._4_4_ = 1;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cerr,Name);
              poVar2 = std::operator<<(poVar2,": error storing BE integer!");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              Name_local._4_4_ = 1;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cerr,Name);
            poVar2 = std::operator<<(poVar2,": error storing LE integer!");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            Name_local._4_4_ = 1;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,Name);
          poVar2 = std::operator<<(poVar2,": error loading BE integer!");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          Name_local._4_4_ = 1;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,Name);
        poVar2 = std::operator<<(poVar2,": error loading LE integer!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Name_local._4_4_ = 1;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,Name);
      poVar2 = std::operator<<(poVar2,": error loading BE integer!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Name_local._4_4_ = 1;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,Name);
    poVar2 = std::operator<<(poVar2,": error loading LE integer!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Name_local._4_4_ = 1;
  }
  return Name_local._4_4_;
}

Assistant:

int test_unsigned(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_4_le[sizeof(T)] = {0};
  ALIGN(alignof(T)) uint8_t cst_4_be[sizeof(T)] = {0};
  cst_4_le[0] = 4;
  cst_4_be[sizeof(T)-1] = 4;
  if (loadu_le<T>(cst_4_le) != 4) {
    std::cerr << Name << ": error loading LE integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_4_be) != 4) {
    std::cerr << Name << ": error loading BE integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_4_le) != 4) {
    std::cerr << Name << ": error loading LE integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_4_be) != 4) {
    std::cerr << Name << ": error loading BE integer!" << std::endl;
    return 1;
  }

  ALIGN(alignof(T)) uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, 4);
  if (memcmp(tmp, cst_4_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(tmp, 4);
  if (memcmp(tmp, cst_4_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, 4);
  if (memcmp(&tmp2, cst_4_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, 4);
  if (memcmp(&tmp2, cst_4_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}